

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

void __thiscall
VmaBlockMetadata_TLSF::Alloc
          (VmaBlockMetadata_TLSF *this,VmaAllocationRequest *request,VmaSuballocationType type,
          void *userData)

{
  Block *this_00;
  long lVar1;
  bool bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  VkDeviceSize VVar5;
  VkDeviceSize VVar6;
  Block *pBVar7;
  VmaBlockMetadata_TLSF *this_01;
  Block **ppBVar8;
  void **ppvVar9;
  void *in_RCX;
  undefined8 *in_RSI;
  VmaBlockMetadata *in_RDI;
  Block *newBlock_2;
  Block *newBlock_1;
  VkDeviceSize size;
  Block *newBlock;
  uint32_t oldList;
  Block *prevBlock;
  VkDeviceSize misssingAlignment;
  VkDeviceSize debugMargin;
  VkDeviceSize offset;
  Block *currentBlock;
  VmaBlockMetadata_TLSF *in_stack_ffffffffffffff90;
  Block *in_stack_ffffffffffffff98;
  uint8_t allocType;
  VmaBlockMetadata_TLSF *in_stack_ffffffffffffffa0;
  Block *in_stack_ffffffffffffffb8;
  
  this_00 = (Block *)*in_RSI;
  lVar1 = in_RSI[5];
  if (this_00 != (Block *)in_RDI[9].m_Size) {
    RemoveFreeBlock(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  }
  VVar5 = VmaBlockMetadata::GetDebugMargin((VmaBlockMetadata *)0x2f231c);
  VVar6 = lVar1 - this_00->offset;
  if (VVar6 != 0) {
    in_stack_ffffffffffffffb8 = this_00->prevPhysical;
    bVar2 = Block::IsFree(in_stack_ffffffffffffffb8);
    if ((bVar2) && (in_stack_ffffffffffffffb8->size != VVar5)) {
      uVar3 = GetListIndex(in_stack_ffffffffffffff90,(VkDeviceSize)in_RDI);
      in_stack_ffffffffffffffb8->size = VVar6 + in_stack_ffffffffffffffb8->size;
      uVar4 = GetListIndex(in_stack_ffffffffffffff90,(VkDeviceSize)in_RDI);
      if (uVar3 == uVar4) {
        in_RDI[1].m_pAllocationCallbacks =
             (VkAllocationCallbacks *)(VVar6 + (long)in_RDI[1].m_pAllocationCallbacks);
      }
      else {
        in_stack_ffffffffffffffb8->size = in_stack_ffffffffffffffb8->size - VVar6;
        RemoveFreeBlock(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
        in_stack_ffffffffffffffb8->size = VVar6 + in_stack_ffffffffffffffb8->size;
        InsertFreeBlock(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      }
    }
    else {
      pBVar7 = VmaPoolAllocator<VmaBlockMetadata_TLSF::Block>::Alloc<>
                         ((VmaPoolAllocator<VmaBlockMetadata_TLSF::Block> *)
                          in_stack_ffffffffffffffb8);
      this_00->prevPhysical = pBVar7;
      in_stack_ffffffffffffffb8->nextPhysical = pBVar7;
      pBVar7->prevPhysical = in_stack_ffffffffffffffb8;
      pBVar7->nextPhysical = this_00;
      pBVar7->size = VVar6;
      pBVar7->offset = this_00->offset;
      Block::MarkTaken(pBVar7);
      InsertFreeBlock(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    }
    this_00->size = this_00->size - VVar6;
    this_00->offset = VVar6 + this_00->offset;
  }
  this_01 = (VmaBlockMetadata_TLSF *)(in_RSI[1] + VVar5);
  if ((VmaBlockMetadata_TLSF *)this_00->size == this_01) {
    if (this_00 == (Block *)in_RDI[9].m_Size) {
      pBVar7 = VmaPoolAllocator<VmaBlockMetadata_TLSF::Block>::Alloc<>
                         ((VmaPoolAllocator<VmaBlockMetadata_TLSF::Block> *)
                          in_stack_ffffffffffffffb8);
      in_RDI[9].m_Size = (VkDeviceSize)pBVar7;
      *(undefined8 *)(in_RDI[9].m_Size + 8) = 0;
      *(VkDeviceSize *)in_RDI[9].m_Size =
           (long)this_01->m_InnerIsFreeBitmap + (this_00->offset - 0x48);
      *(Block **)(in_RDI[9].m_Size + 0x10) = this_00;
      *(undefined8 *)(in_RDI[9].m_Size + 0x18) = 0;
      Block::MarkFree((Block *)in_RDI[9].m_Size);
      ppBVar8 = Block::PrevFree((Block *)in_RDI[9].m_Size);
      *ppBVar8 = (Block *)0x0;
      ppBVar8 = Block::NextFree((Block *)in_RDI[9].m_Size);
      *ppBVar8 = (Block *)0x0;
      this_00->nextPhysical = (Block *)in_RDI[9].m_Size;
      Block::MarkTaken(this_00);
    }
  }
  else {
    in_stack_ffffffffffffff98 =
         VmaPoolAllocator<VmaBlockMetadata_TLSF::Block>::Alloc<>
                   ((VmaPoolAllocator<VmaBlockMetadata_TLSF::Block> *)in_stack_ffffffffffffffb8);
    in_stack_ffffffffffffff98->size = this_00->size - (long)this_01;
    in_stack_ffffffffffffff98->offset =
         (long)this_01->m_InnerIsFreeBitmap + (this_00->offset - 0x48);
    in_stack_ffffffffffffff98->prevPhysical = this_00;
    in_stack_ffffffffffffff98->nextPhysical = this_00->nextPhysical;
    this_00->nextPhysical = in_stack_ffffffffffffff98;
    this_00->size = (VkDeviceSize)this_01;
    if (this_00 == (Block *)in_RDI[9].m_Size) {
      in_RDI[9].m_Size = (VkDeviceSize)in_stack_ffffffffffffff98;
      Block::MarkFree((Block *)in_RDI[9].m_Size);
      ppBVar8 = Block::NextFree((Block *)in_RDI[9].m_Size);
      *ppBVar8 = (Block *)0x0;
      ppBVar8 = Block::PrevFree((Block *)in_RDI[9].m_Size);
      *ppBVar8 = (Block *)0x0;
      Block::MarkTaken(this_00);
    }
    else {
      in_stack_ffffffffffffff98->nextPhysical->prevPhysical = in_stack_ffffffffffffff98;
      Block::MarkTaken(in_stack_ffffffffffffff98);
      InsertFreeBlock(this_01,in_stack_ffffffffffffff98);
    }
  }
  ppvVar9 = Block::UserData(this_00);
  *ppvVar9 = in_RCX;
  if (VVar5 != 0) {
    this_00->size = this_00->size - VVar5;
    in_stack_ffffffffffffff90 =
         (VmaBlockMetadata_TLSF *)
         VmaPoolAllocator<VmaBlockMetadata_TLSF::Block>::Alloc<>
                   ((VmaPoolAllocator<VmaBlockMetadata_TLSF::Block> *)in_stack_ffffffffffffffb8);
    (in_stack_ffffffffffffff90->super_VmaBlockMetadata).m_Size = VVar5;
    (in_stack_ffffffffffffff90->super_VmaBlockMetadata)._vptr_VmaBlockMetadata =
         (_func_int **)(this_00->offset + this_00->size);
    (in_stack_ffffffffffffff90->super_VmaBlockMetadata).m_pAllocationCallbacks =
         (VkAllocationCallbacks *)this_00;
    (in_stack_ffffffffffffff90->super_VmaBlockMetadata).m_BufferImageGranularity =
         (VkDeviceSize)this_00->nextPhysical;
    Block::MarkTaken((Block *)in_stack_ffffffffffffff90);
    this_00->nextPhysical->prevPhysical = (Block *)in_stack_ffffffffffffff90;
    this_00->nextPhysical = (Block *)in_stack_ffffffffffffff90;
    InsertFreeBlock(this_01,in_stack_ffffffffffffff98);
  }
  allocType = (uint8_t)((ulong)in_stack_ffffffffffffff98 >> 0x38);
  bVar2 = VmaBlockMetadata::IsVirtual(in_RDI);
  if (!bVar2) {
    VmaBlockBufferImageGranularity::AllocPages
              ((VmaBlockBufferImageGranularity *)this_01,allocType,
               (VkDeviceSize)in_stack_ffffffffffffff90,(VkDeviceSize)in_RDI);
  }
  in_RDI[1]._vptr_VmaBlockMetadata = (_func_int **)((long)in_RDI[1]._vptr_VmaBlockMetadata + 1);
  return;
}

Assistant:

void VmaBlockMetadata_TLSF::Alloc(
    const VmaAllocationRequest& request,
    VmaSuballocationType type,
    void* userData)
{
    VMA_ASSERT(request.type == VmaAllocationRequestType::TLSF);

    // Get block and pop it from the free list
    Block* currentBlock = (Block*)request.allocHandle;
    VkDeviceSize offset = request.algorithmData;
    VMA_ASSERT(currentBlock != VMA_NULL);
    VMA_ASSERT(currentBlock->offset <= offset);

    if (currentBlock != m_NullBlock)
        RemoveFreeBlock(currentBlock);

    VkDeviceSize debugMargin = GetDebugMargin();
    VkDeviceSize misssingAlignment = offset - currentBlock->offset;

    // Append missing alignment to prev block or create new one
    if (misssingAlignment)
    {
        Block* prevBlock = currentBlock->prevPhysical;
        VMA_ASSERT(prevBlock != VMA_NULL && "There should be no missing alignment at offset 0!");

        if (prevBlock->IsFree() && prevBlock->size != debugMargin)
        {
            uint32_t oldList = GetListIndex(prevBlock->size);
            prevBlock->size += misssingAlignment;
            // Check if new size crosses list bucket
            if (oldList != GetListIndex(prevBlock->size))
            {
                prevBlock->size -= misssingAlignment;
                RemoveFreeBlock(prevBlock);
                prevBlock->size += misssingAlignment;
                InsertFreeBlock(prevBlock);
            }
            else
                m_BlocksFreeSize += misssingAlignment;
        }
        else
        {
            Block* newBlock = m_BlockAllocator.Alloc();
            currentBlock->prevPhysical = newBlock;
            prevBlock->nextPhysical = newBlock;
            newBlock->prevPhysical = prevBlock;
            newBlock->nextPhysical = currentBlock;
            newBlock->size = misssingAlignment;
            newBlock->offset = currentBlock->offset;
            newBlock->MarkTaken();

            InsertFreeBlock(newBlock);
        }

        currentBlock->size -= misssingAlignment;
        currentBlock->offset += misssingAlignment;
    }

    VkDeviceSize size = request.size + debugMargin;
    if (currentBlock->size == size)
    {
        if (currentBlock == m_NullBlock)
        {
            // Setup new null block
            m_NullBlock = m_BlockAllocator.Alloc();
            m_NullBlock->size = 0;
            m_NullBlock->offset = currentBlock->offset + size;
            m_NullBlock->prevPhysical = currentBlock;
            m_NullBlock->nextPhysical = VMA_NULL;
            m_NullBlock->MarkFree();
            m_NullBlock->PrevFree() = VMA_NULL;
            m_NullBlock->NextFree() = VMA_NULL;
            currentBlock->nextPhysical = m_NullBlock;
            currentBlock->MarkTaken();
        }
    }
    else
    {
        VMA_ASSERT(currentBlock->size > size && "Proper block already found, shouldn't find smaller one!");

        // Create new free block
        Block* newBlock = m_BlockAllocator.Alloc();
        newBlock->size = currentBlock->size - size;
        newBlock->offset = currentBlock->offset + size;
        newBlock->prevPhysical = currentBlock;
        newBlock->nextPhysical = currentBlock->nextPhysical;
        currentBlock->nextPhysical = newBlock;
        currentBlock->size = size;

        if (currentBlock == m_NullBlock)
        {
            m_NullBlock = newBlock;
            m_NullBlock->MarkFree();
            m_NullBlock->NextFree() = VMA_NULL;
            m_NullBlock->PrevFree() = VMA_NULL;
            currentBlock->MarkTaken();
        }
        else
        {
            newBlock->nextPhysical->prevPhysical = newBlock;
            newBlock->MarkTaken();
            InsertFreeBlock(newBlock);
        }
    }
    currentBlock->UserData() = userData;

    if (debugMargin > 0)
    {
        currentBlock->size -= debugMargin;
        Block* newBlock = m_BlockAllocator.Alloc();
        newBlock->size = debugMargin;
        newBlock->offset = currentBlock->offset + currentBlock->size;
        newBlock->prevPhysical = currentBlock;
        newBlock->nextPhysical = currentBlock->nextPhysical;
        newBlock->MarkTaken();
        currentBlock->nextPhysical->prevPhysical = newBlock;
        currentBlock->nextPhysical = newBlock;
        InsertFreeBlock(newBlock);
    }

    if (!IsVirtual())
        m_GranularityHandler.AllocPages((uint8_t)(uintptr_t)request.customData,
            currentBlock->offset, currentBlock->size);
    ++m_AllocCount;
}